

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O1

Oop Lodtalk::ByteString::splitVariableNames(VMContext *context,string *string)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar5;
  ulong uVar6;
  ulong uVar7;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> varNameIndices;
  Ref<Lodtalk::Array> result;
  pair<int,_int> *local_68;
  iterator iStack_60;
  pair<int,_int> *local_58;
  anon_union_8_4_0eb573b0_for_Oop_0 local_50;
  VMContext *local_48;
  
  local_68 = (pair<int,_int> *)0x0;
  iStack_60._M_current = (pair<int,_int> *)0x0;
  local_58 = (pair<int,_int> *)0x0;
  pcVar2 = (string->_M_dataplus)._M_p;
  uVar7 = string->_M_string_length;
  uVar4 = 0xffffffff;
  iVar3 = -1;
  if (uVar7 != 0) {
    uVar6 = 0;
    do {
      cVar1 = pcVar2[uVar6];
      iVar3 = (int)uVar4;
      if (iVar3 < 0) {
        if (' ' < cVar1) {
          uVar4 = uVar6 & 0xffffffff;
        }
      }
      else if (cVar1 < '!') {
        local_50.uintValue._4_4_ = (int)uVar6 - iVar3;
        local_50.intValue._0_4_ = iVar3;
        if (iStack_60._M_current == local_58) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          _M_realloc_insert<std::pair<int,int>>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_68,
                     iStack_60,(pair<int,_int> *)&local_50);
        }
        else {
          *iStack_60._M_current = (pair<int,_int>)local_50;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
        uVar4 = 0xffffffff;
      }
      iVar3 = (int)uVar4;
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  if (-1 < iVar3) {
    local_50.uintValue._4_4_ = (int)uVar7 - iVar3;
    local_50.intValue._0_4_ = iVar3;
    if (iStack_60._M_current == local_58) {
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      _M_realloc_insert<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_68,
                 iStack_60,(pair<int,_int> *)&local_50);
    }
    else {
      *iStack_60._M_current = (pair<int,_int>)local_50;
      iStack_60._M_current = iStack_60._M_current + 1;
    }
  }
  aVar5.header = VMContext::newObject
                           (context,0,(long)iStack_60._M_current - (long)local_68 >> 3,
                            OF_VARIABLE_SIZE_NO_IVARS,0x36,-1);
  local_50.pointer = (uint8_t *)&NilObject;
  local_48 = context;
  OopRef::registerSelf((OopRef *)&local_50);
  local_50.header = aVar5.header;
  if (iStack_60._M_current != local_68) {
    uVar7 = 0;
    do {
      aVar5 = (anon_union_8_4_0eb573b0_for_Oop_0)
              ByteSymbol::fromNativeRange
                        (context,pcVar2 + local_68[uVar7].first,(long)local_68[uVar7].second);
      if ((ObjectHeader *)local_50.pointer == (ObjectHeader *)&NilObject) {
        __assert_fail("!isNil()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                      ,0x3bf,
                      "T *Lodtalk::Ref<Lodtalk::Array>::operator->() const [T = Lodtalk::Array]");
      }
      *(anon_union_8_4_0eb573b0_for_Oop_0 *)((ObjectHeader *)(local_50.uintValue + 8) + uVar7) =
           aVar5;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)iStack_60._M_current - (long)local_68 >> 3));
  }
  aVar5 = local_50;
  OopRef::unregisterSelf((OopRef *)&local_50);
  if (local_68 != (pair<int,_int> *)0x0) {
    operator_delete(local_68);
  }
  return (Oop)aVar5;
}

Assistant:

Oop ByteString::splitVariableNames(VMContext *context, const std::string &string)
{
	std::vector<std::pair<int, int>> varNameIndices;

	auto data = string.data();
	auto size = string.size();
	int tokenStart = -1;

	for(size_t i = 0; i < size; ++i)
	{
		auto c = data[i];
		if(tokenStart < 0)
		{
			// I am not in a token.
			if(c > ' ')
				tokenStart = (int)i;
		}
		else
		{
			// Inside token.
			if(c <= ' ')
			{
				varNameIndices.push_back(std::make_pair(tokenStart, i - tokenStart));
				tokenStart = -1;
			}
		}
	}

	// Push the last token.
	if(tokenStart >= 0)
		varNameIndices.push_back(std::make_pair(tokenStart, size - tokenStart));

	// Allocate the result.
	Ref<Array> result(context, Array::basicNativeNew(context, varNameIndices.size()));
	for(size_t i = 0; i < varNameIndices.size(); ++i)
	{
		auto &startSize = varNameIndices[i];
		auto subString = ByteSymbol::fromNativeRange(context, (char*)data + startSize.first, startSize.second);
		auto resultData = reinterpret_cast<Oop*> (result->getFirstFieldPointer());
		resultData[i] = subString;
	}

	return result.getOop();
}